

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall DirectionCone_UnionRandoms_Test::TestBody(DirectionCone_UnionRandoms_Test *this)

{
  byte bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  uint64_t uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t uVar7;
  char *in_R9;
  int iVar8;
  ulong uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  AssertionResult gtest_ar_;
  DirectionCone c;
  DirectionCone b;
  DirectionCone a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  string local_118;
  RNG local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  internal local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  DirectionCone local_b4;
  DirectionCone local_a0;
  DirectionCone local_8c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ulong local_50;
  AssertHelper local_48;
  Tuple3<pbrt::Vector3,_float> local_40;
  
  local_f8.inc = 0x21;
  local_f8.state = 0xff54477fb4c4008b;
  local_50 = 0;
  do {
    RandomCone(&local_8c,&local_f8);
    RandomCone(&local_a0,&local_f8);
    pbrt::Union(&local_b4,&local_8c,&local_a0);
    uVar3 = local_f8.inc;
    iVar8 = 100;
    uVar7 = local_f8.state;
    do {
      uVar6 = uVar7 * 0x5851f42d4c957f2d + uVar3;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar7;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar6;
      auVar14 = vpunpcklqdq_avx(auVar18,auVar12);
      auVar11 = vpsrlvq_avx2(auVar14,_DAT_005655d0);
      auVar12 = vpsrlvq_avx2(auVar14,_DAT_005655c0);
      auVar11 = vpshufd_avx(auVar12 ^ auVar11,0xe8);
      auVar14 = vpsrlq_avx(auVar14,0x3b);
      auVar14 = vpshufd_avx(auVar14,0xe8);
      auVar11 = vprorvd_avx512vl(auVar11,auVar14);
      auVar14 = vcvtudq2ps_avx512vl(auVar11);
      auVar11._8_4_ = 0x2f800000;
      auVar11._0_8_ = 0x2f8000002f800000;
      auVar11._12_4_ = 0x2f800000;
      auVar12 = vmulps_avx512vl(auVar14,auVar11);
      auVar14._8_4_ = 0x3f7fffff;
      auVar14._0_8_ = 0x3f7fffff3f7fffff;
      auVar14._12_4_ = 0x3f7fffff;
      uVar9 = vcmpps_avx512vl(auVar12,auVar14,1);
      bVar1 = (byte)(uVar9 >> 1);
      auVar11 = vmovshdup_avx(auVar12);
      local_68._0_4_ = auVar12._0_4_ * 6.2831855;
      local_78 = vfmadd132ss_fma(ZEXT416((uint)(bVar1 & 1) * auVar11._0_4_ +
                                         (uint)!(bool)(bVar1 & 1) * 0x3f7fffff),
                                 SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
      auVar11 = vfnmadd213ss_fma(local_78,local_78,SUB6416(ZEXT464(0x3f800000),0));
      auVar11 = vmaxss_avx(auVar11,ZEXT816(0));
      if (auVar11._0_4_ < 0.0) {
        local_d8._0_4_ = (int)uVar9;
        local_68 = ZEXT416((uint)local_68._0_4_);
        fVar10 = sqrtf(auVar11._0_4_);
        uVar9 = (ulong)(uint)local_d8._0_4_;
      }
      else {
        auVar11 = vsqrtss_avx(auVar11,auVar11);
        fVar10 = auVar11._0_4_;
      }
      local_e8._0_4_ = fVar10;
      uVar7 = uVar6 * 0x5851f42d4c957f2d + uVar3;
      fVar10 = (float)((uint)((byte)uVar9 & 1) * local_68._0_4_ +
                      (uint)!(bool)((byte)uVar9 & 1) * 0x40c90fda);
      local_68 = ZEXT416((uint)fVar10);
      fVar10 = cosf(fVar10);
      local_d8 = ZEXT416((uint)(fVar10 * (float)local_e8._0_4_));
      fVar10 = sinf((float)local_68._0_4_);
      fVar10 = fVar10 * (float)local_e8._0_4_;
      uVar22 = 0;
      uVar23 = 0;
      uVar24 = 0;
      auVar11 = vinsertps_avx(local_d8,ZEXT416((uint)fVar10),0x10);
      local_40._0_8_ = vmovlps_avx(auVar11);
      local_40.z = local_78._0_4_;
      if (local_8c.empty == false) {
        fVar13 = local_d8._0_4_ * local_d8._0_4_ + fVar10 * fVar10 + local_40.z * local_40.z;
        if (fVar13 < 0.0) {
          local_e8 = ZEXT416((uint)fVar10);
          fVar13 = sqrtf(fVar13);
          fVar10 = (float)local_e8._0_4_;
          uVar22 = local_e8._4_4_;
          uVar23 = local_e8._8_4_;
          uVar24 = local_e8._12_4_;
        }
        else {
          auVar11 = vsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
          fVar13 = auVar11._0_4_;
          uVar22 = 0;
          uVar23 = 0;
          uVar24 = 0;
        }
        auVar19._0_4_ = local_d8._0_4_ / fVar13;
        auVar19._4_12_ = local_d8._4_12_;
        auVar15._0_4_ = local_78._0_4_ / fVar13;
        auVar15._4_12_ = local_78._4_12_;
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar10 / fVar13) *
                                                local_8c.w.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  auVar19,ZEXT416((uint)local_8c.w.
                                                        super_Tuple3<pbrt::Vector3,_float>.x));
        auVar11 = vfmadd231ss_fma(auVar11,auVar15,
                                  ZEXT416((uint)local_8c.w.super_Tuple3<pbrt::Vector3,_float>.z));
        if (auVar11._0_4_ < local_8c.cosTheta) goto LAB_0030eaba;
LAB_0030eb44:
        if (local_b4.empty == false) {
          fVar13 = local_d8._0_4_ * local_d8._0_4_ + fVar10 * fVar10 +
                   local_78._0_4_ * local_78._0_4_;
          if (fVar13 < 0.0) {
            local_e8._4_4_ = uVar22;
            local_e8._0_4_ = fVar10;
            local_e8._8_4_ = uVar23;
            local_e8._12_4_ = uVar24;
            fVar13 = sqrtf(fVar13);
            fVar10 = (float)local_e8._0_4_;
          }
          else {
            auVar11 = vsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
            fVar13 = auVar11._0_4_;
          }
          auVar21._0_4_ = local_d8._0_4_ / fVar13;
          auVar21._4_12_ = local_d8._4_12_;
          auVar17._0_4_ = local_78._0_4_ / fVar13;
          auVar17._4_12_ = local_78._4_12_;
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar10 / fVar13) *
                                                  local_b4.w.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    auVar21,ZEXT416((uint)local_b4.w.
                                                          super_Tuple3<pbrt::Vector3,_float>.x));
          auVar11 = vfmadd231ss_fma(auVar11,auVar17,
                                    ZEXT416((uint)local_b4.w.super_Tuple3<pbrt::Vector3,_float>.z));
          local_c8[0] = (internal)(local_b4.cosTheta <= auVar11._0_4_);
          local_c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_c8[0]) goto LAB_0030ebe2;
        }
        else {
          local_c8[0] = (internal)0x0;
LAB_0030ebe2:
          local_c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_120);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_120.ptr_ + 0x10),"a: ",3);
          sVar2.ptr_ = local_120.ptr_;
          pbrt::DirectionCone::ToString_abi_cxx11_(&local_118,&local_8c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(sVar2.ptr_ + 0x10),local_118._M_dataplus._M_p,
                     local_118._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_120.ptr_ + 0x10),", b: ",5);
          sVar2.ptr_ = local_120.ptr_;
          pbrt::DirectionCone::ToString_abi_cxx11_(&local_118,&local_a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(sVar2.ptr_ + 0x10),local_118._M_dataplus._M_p,
                     local_118._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_120.ptr_ + 0x10),", union: ",9);
          sVar2.ptr_ = local_120.ptr_;
          pbrt::DirectionCone::ToString_abi_cxx11_(&local_118,&local_b4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(sVar2.ptr_ + 0x10),local_118._M_dataplus._M_p,
                     local_118._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_120.ptr_ + 0x10),", w: ",5);
          pbrt::operator<<((ostream *)(local_120.ptr_ + 0x10),(Vector3<float> *)&local_40);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_118,local_c8,(AssertionResult *)"Inside(c, w)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                     ,0x182,local_118._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_120.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_120.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_120.ptr_ + 8))();
            }
            local_120.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
LAB_0030eaba:
        if (local_a0.empty == false) {
          fVar13 = local_d8._0_4_ * local_d8._0_4_ + fVar10 * fVar10 +
                   local_78._0_4_ * local_78._0_4_;
          if (fVar13 < 0.0) {
            local_e8._4_4_ = uVar22;
            local_e8._0_4_ = fVar10;
            local_e8._8_4_ = uVar23;
            local_e8._12_4_ = uVar24;
            fVar13 = sqrtf(fVar13);
            fVar10 = (float)local_e8._0_4_;
            uVar22 = local_e8._4_4_;
            uVar23 = local_e8._8_4_;
            uVar24 = local_e8._12_4_;
          }
          else {
            auVar11 = vsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
            fVar13 = auVar11._0_4_;
          }
          auVar20._0_4_ = local_d8._0_4_ / fVar13;
          auVar20._4_12_ = local_d8._4_12_;
          auVar16._0_4_ = local_78._0_4_ / fVar13;
          auVar16._4_12_ = local_78._4_12_;
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar10 / fVar13) *
                                                  local_a0.w.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    auVar20,ZEXT416((uint)local_a0.w.
                                                          super_Tuple3<pbrt::Vector3,_float>.x));
          auVar11 = vfmadd231ss_fma(auVar11,auVar16,
                                    ZEXT416((uint)local_a0.w.super_Tuple3<pbrt::Vector3,_float>.z));
          if (local_a0.cosTheta <= auVar11._0_4_) goto LAB_0030eb44;
        }
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    uVar5 = (int)local_50 + 1;
    local_50 = (ulong)uVar5;
    local_f8.state = uVar7;
    if (uVar5 == 100) {
      return;
    }
  } while( true );
}

Assistant:

TEST(DirectionCone, UnionRandoms) {
    RNG rng(16);

    for (int i = 0; i < 100; ++i) {
        DirectionCone a = RandomCone(rng), b = RandomCone(rng);
        DirectionCone c = Union(a, b);

        for (int j = 0; j < 100; ++j) {
            Vector3f w =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            if (Inside(a, w) || Inside(b, w))
                EXPECT_TRUE(Inside(c, w))
                    << "a: " << a << ", b: " << b << ", union: " << c << ", w: " << w;
        }
    }
}